

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

ssize_t session_call_select_padding
                  (nghttp2_session *session,nghttp2_frame *frame,size_t max_payloadlen)

{
  nghttp2_select_padding_callback p_Var1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (frame->hd).length;
  if ((uVar3 < max_payloadlen) &&
     (p_Var1 = (session->callbacks).select_padding_callback,
     p_Var1 != (nghttp2_select_padding_callback)0x0)) {
    uVar4 = uVar3 + 0x100;
    if (max_payloadlen <= uVar3 + 0x100) {
      uVar4 = max_payloadlen;
    }
    uVar2 = (*p_Var1)(session,frame,uVar4,session->user_data);
    uVar3 = uVar2;
    if ((long)uVar2 < (long)(frame->hd).length) {
      uVar3 = 0xfffffffffffffc7a;
    }
    if ((long)uVar4 < (long)uVar2) {
      uVar3 = 0xfffffffffffffc7a;
    }
  }
  return uVar3;
}

Assistant:

static ssize_t session_call_select_padding(nghttp2_session *session,
                                           const nghttp2_frame *frame,
                                           size_t max_payloadlen) {
  ssize_t rv;

  if (frame->hd.length >= max_payloadlen) {
    return (ssize_t)frame->hd.length;
  }

  if (session->callbacks.select_padding_callback) {
    size_t max_paddedlen;

    max_paddedlen =
        nghttp2_min(frame->hd.length + NGHTTP2_MAX_PADLEN, max_payloadlen);

    rv = session->callbacks.select_padding_callback(
        session, frame, max_paddedlen, session->user_data);
    if (rv < (ssize_t)frame->hd.length || rv > (ssize_t)max_paddedlen) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
    return rv;
  }
  return (ssize_t)frame->hd.length;
}